

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

int __thiscall
Lib::
SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
::size(SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
       *this)

{
  bool bVar1;
  SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
  *in_RDI;
  Iterator it;
  int res;
  Rhs RStack_38;
  Iterator local_18;
  int local_c;
  
  local_c = 0;
  Iterator::Iterator(&local_18,in_RDI);
  while( true ) {
    bVar1 = Iterator::hasNext(&local_18);
    if (!bVar1) break;
    Iterator::next(&RStack_38,&local_18);
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int size() const
  {
    int res=0;
    Iterator it(*this);
    while(it.hasNext()) {
      it.next();
      res++;
    }
    return res;
  }